

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.h
# Opt level: O1

int __thiscall
connector::server<(connector::CONNECTOR_TYPE)0>::init
          (server<(connector::CONNECTOR_TYPE)0> *this,EVP_PKEY_CTX *ctx)

{
  ushort uVar1;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  char *pcVar5;
  char local_36 [8];
  char local_2e [6];
  
  iVar2 = socket(2,1,0);
  this->_listen_socket = iVar2;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"[CONNECTOR - ",0xd);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"server.h",8);
  if (iVar2 == -1) {
    local_2e[5] = 0x3a;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_2e + 5,1);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x3f);
    local_2e[4] = 0x3a;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_2e + 4,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"init",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"()]: ",5);
    pcVar5 = "Error creating socket with -1\n";
    lVar4 = 0x1e;
  }
  else {
    local_2e[3] = 0x3a;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_2e + 3,1);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x42);
    local_2e[2] = 0x3a;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_2e + 2,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"init",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"()]: ",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Created socket!\n",0x10);
    (this->_ourAddr).sin_family = 2;
    (this->_ourAddr).sin_addr.s_addr = 0;
    uVar1 = (ushort)this->_port;
    (this->_ourAddr).sin_port = uVar1 << 8 | uVar1 >> 8;
    iVar2 = bind(this->_listen_socket,(sockaddr *)this,0x10);
    this->_bnd = iVar2;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"[CONNECTOR - ",0xd);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"server.h",8);
    if (iVar2 < 0) {
      local_2e[1] = 0x3a;
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,local_2e + 1,1);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x4b);
      local_2e[0] = ':';
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_2e,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"init",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"()]: ",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Error binding with error: ",0x1a);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->_bnd);
      pcVar5 = local_36 + 7;
    }
    else {
      local_36[6] = 0x3a;
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,local_36 + 6,1);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x4e);
      local_36[5] = 0x3a;
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_36 + 5,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"init",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"()]: ",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Binding successful to port ",0x1b);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->_port);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"!\n",2);
      listen(this->_listen_socket,1);
      this->_len = 0x10;
      iVar2 = accept(this->_listen_socket,(sockaddr *)&this->_cliAddr,&this->_len);
      this->_skt = iVar2;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"[CONNECTOR - ",0xd);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"server.h",8);
      if (-1 < iVar2) {
        local_36[1] = 0x3a;
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,local_36 + 1,1);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x5b);
        local_36[0] = ':';
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_36,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"init",4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"()]: ",5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"All clients (",0xd);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"1",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,") connected!\n",0xd);
        return this->_skt;
      }
      local_36[4] = 0x3a;
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,local_36 + 4,1);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x56);
      local_36[3] = 0x3a;
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_36 + 3,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"init",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"()]: ",5);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,"Connection accept failed with error: ",0x25);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->_skt);
      pcVar5 = local_36 + 2;
    }
    *pcVar5 = '\n';
    lVar4 = 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar5,lVar4);
  return -1;
}

Assistant:

int init( ) {
        // creating socket
        _listen_socket = socket( AF_INET, SOCK_STREAM, 0 );
        if ( _listen_socket == -1 ) {
            DEBUG_CRIT_MSG_CONNECTOR( "Error creating socket with -1\n" );
            return -1;
        } else {
            DEBUG_MSG_CONNECTOR( "Created socket!\n" );
        }

        // binding port
        _ourAddr.sin_family      = AF_INET;
        _ourAddr.sin_addr.s_addr = INADDR_ANY;
        _ourAddr.sin_port        = htons( _port );
        _bnd = bind( _listen_socket, (struct sockaddr *)&_ourAddr, sizeof( _ourAddr ) );
        if ( _bnd < 0 ) {
            DEBUG_CRIT_MSG_CONNECTOR( "Error binding with error: " << _bnd << '\n' );
            return -1;
        } else {
            DEBUG_MSG_CONNECTOR( "Binding successful to port " << _port << "!\n" );
        }

        // waiting for _skt clients to connect (blocking)
        listen( _listen_socket, 1 );
        _len = sizeof( struct sockaddr_in );
        _skt = accept( _listen_socket, (struct sockaddr *)&_cliAddr, (socklen_t *)&_len );
        if ( _skt < 0 ) {
            DEBUG_CRIT_MSG_CONNECTOR( "Connection accept failed with error: " << _skt << '\n');
            return -1;
        } else {
            DEBUG_MSG_CONNECTOR( "All clients ("
                                << "1"
                                << ") connected!\n" );
        }
        return _skt;
    }